

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O2

void SL::WS_LITE::
     ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *extradata)

{
  uchar uVar1;
  byte bVar2;
  element_type *peVar3;
  shared_ptr<unsigned_char> *psVar4;
  void *pvVar5;
  size_t sVar6;
  uchar *puVar7;
  ostream *poVar8;
  element_type *__size;
  string *this;
  element_type *desired_bytes_to_read;
  shared_ptr<unsigned_char> buffer;
  shared_ptr<unsigned_char> ptr;
  __shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
  local_1a0;
  __shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> local_190 [21];
  mutable_buffers_1 local_40;
  
  this = (string *)&buffer;
  peVar3 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  uVar1 = peVar3->ReceiveHeader[1];
  desired_bytes_to_read = (element_type *)(long)(char)uVar1;
  if ((long)desired_bytes_to_read < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ptr,"Closing connection because mask requirement not met",
               (allocator<char> *)&buffer);
    sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
              (socket,0x3ea,(string *)&ptr);
  }
  else {
    bVar2 = peVar3->ReceiveHeader[0];
    if (((bVar2 & 0x30) == 0) && (((bVar2 & 0x40) == 0 || (peVar3->ExtensionOption != NO_OPTIONS))))
    {
      if (uVar1 == '\x7f') {
        desired_bytes_to_read =
             (element_type *)
             ntoh<unsigned_long_long>(*(unsigned_long_long *)(peVar3->ReceiveHeader + 2));
      }
      else if (uVar1 == '~') {
        desired_bytes_to_read =
             (element_type *)
             (ulong)(ushort)(*(ushort *)(peVar3->ReceiveHeader + 2) << 8 |
                            *(ushort *)(peVar3->ReceiveHeader + 2) >> 8);
      }
      ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           desired_bytes_to_read;
      if ((byte)((bVar2 & 0xf) - 8) < 3) {
        if (desired_bytes_to_read < (element_type *)0x7e) {
          if (desired_bytes_to_read == (element_type *)0x0) {
            ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ProcessControlMessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                      (socket,&ptr,0,extradata);
            psVar4 = &ptr;
          }
          else {
            pvVar5 = operator_new__((ulong)desired_bytes_to_read);
            std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<unsigned_char,SL::WS_LITE::ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)::_lambda(unsigned_char*)_1_,void>
                      ((__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&buffer,pvVar5);
            sVar6 = ReadFromExtraData(buffer.
                                      super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr,(size_t)desired_bytes_to_read,extradata);
            local_40.super_mutable_buffer.size_ = (long)desired_bytes_to_read - sVar6;
            peVar3 = (socket->
                     super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            local_40.super_mutable_buffer.data_ =
                 buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + sVar6
            ;
            std::
            __shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr((__shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          *)&ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,
                         &extradata->
                          super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        );
            std::
            __shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr(&local_1a0,
                           &socket->
                            super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                          );
            std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (local_190,
                       &buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
            asio::
            async_read<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffers_1,SL::WS_LITE::ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)::_lambda(std::error_code_const&,unsigned_long)_1_>
                      (&peVar3->Socket,&local_40,(type *)&ptr,(type *)0x0);
            ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)
            ::{lambda(std::error_code_const&,unsigned_long)#1}::~error_code
                      ((_lambda_std__error_code_const__unsigned_long__1_ *)&ptr);
            psVar4 = &buffer;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&(psVar4->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
          return;
        }
        std::__cxx11::to_string((string *)&buffer,(unsigned_long)desired_bytes_to_read);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ptr,
                       "Payload exceeded for control frames. Size requested ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer)
        ;
        sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                  (socket,0x3ea,(string *)&ptr);
        std::__cxx11::string::~string((string *)&ptr);
        goto LAB_00136f72;
      }
      if ((bVar2 & 0xf) < 3) {
        peVar3 = (socket->
                 super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        __size = desired_bytes_to_read + peVar3->ReceiveBufferSize;
        peVar3->ReceiveBufferSize = (size_t)__size;
        if ((element_type *)
            ((peVar3->Parent).
             super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            MaxPayload < __size) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ptr,"Payload exceeded MaxPayload size",(allocator<char> *)&buffer);
          sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                    (socket,0x3f1,(string *)&ptr);
        }
        else {
          if (desired_bytes_to_read == (element_type *)0x0) {
            ProcessMessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                      (socket,extradata);
            return;
          }
          puVar7 = (uchar *)realloc(peVar3->ReceiveBuffer,(size_t)__size);
          peVar3 = (socket->
                   super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          peVar3->ReceiveBuffer = puVar7;
          if (puVar7 != (uchar *)0x0) {
            sVar6 = ReadFromExtraData(puVar7 + (peVar3->ReceiveBufferSize -
                                               (long)desired_bytes_to_read),
                                      (size_t)desired_bytes_to_read,extradata);
            buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(desired_bytes_to_read + -sVar6);
            peVar3 = (socket->
                     super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            buffer.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar3->ReceiveBuffer +
                 sVar6 + (peVar3->ReceiveBufferSize - (long)desired_bytes_to_read);
            std::
            __shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr((__shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          *)&ptr.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,
                         &extradata->
                          super___shared_ptr<asio::basic_streambuf<std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        );
            std::
            __shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr(&local_1a0,
                           &socket->
                            super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                          );
            asio::
            async_read<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffers_1,SL::WS_LITE::ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)::_lambda(std::error_code_const&,unsigned_long)_2_>
                      (&peVar3->Socket,(mutable_buffers_1 *)&buffer,(type *)&ptr,(type *)0x0);
            ReadBody<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>(std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>const&,std::shared_ptr<asio::basic_streambuf<std::allocator<char>>>const&)
            ::{lambda(std::error_code_const&,unsigned_long)#2}::~error_code
                      ((_lambda_std__error_code_const__unsigned_long__2_ *)&ptr);
            return;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ptr);
          poVar8 = std::operator<<((ostream *)&ptr,"MEMORY ALLOCATION ERROR!!! Tried to realloc ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          Log(ERROR_log_level,
              "/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/include/internal/WebSocketProtocol.h"
              ,0x1cd,"ReadBody",(ostringstream *)&ptr);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ptr);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ptr,"Payload exceeded MaxPayload size",(allocator<char> *)&buffer);
          sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                    (socket,0x3f1,(string *)&ptr);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ptr,"Closing connection. nonvalid op code",(allocator<char> *)&buffer)
        ;
        sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                  (socket,0x3ea,(string *)&ptr);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ptr,"Closing connection. rsv bit set",(allocator<char> *)&buffer);
      sendclosemessage<false,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>>>
                (socket,0x3ea,(string *)&ptr);
    }
  }
  this = (string *)&ptr;
LAB_00136f72:
  std::__cxx11::string::~string(this);
  return;
}

Assistant:

inline void ReadBody(const SOCKETTYPE &socket, const std::shared_ptr<asio::streambuf> &extradata)
    {
        if (!DidPassMaskRequirement(socket->ReceiveHeader, isServer)) { // Close connection if it did not meet the mask requirement.
            return sendclosemessage<isServer>(socket, 1002, "Closing connection because mask requirement not met");
        }
        if (getrsv2(socket->ReceiveHeader) || getrsv3(socket->ReceiveHeader) ||
            (getrsv1(socket->ReceiveHeader) && socket->ExtensionOption == ExtensionOptions::NO_OPTIONS)) {
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. rsv bit set");
        }
        auto opcode = static_cast<OpCode>(getOpCode(socket->ReceiveHeader));

        size_t size = getpayloadLength1(socket->ReceiveHeader);
        switch (size) {
        case 126:
            size = ntoh(getpayloadLength2(socket->ReceiveHeader));
            break;
        case 127:
            size = static_cast<size_t>(ntoh(getpayloadLength8(socket->ReceiveHeader)));
            if (size > std::numeric_limits<std::size_t>::max()) {
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }
            break;
        default:
            break;
        }

        size += AdditionalBodyBytesToRead(isServer);
        if (opcode == OpCode::PING || opcode == OpCode::PONG || opcode == OpCode::CLOSE) {
            if (size - AdditionalBodyBytesToRead(isServer) > CONTROLBUFFERMAXSIZE) {
                return sendclosemessage<isServer>(socket, 1002, "Payload exceeded for control frames. Size requested " + std::to_string(size));
            }
            else if (size > 0) {
                auto buffer = std::shared_ptr<unsigned char>(new unsigned char[size], [](unsigned char *p) { delete[] p; });

                auto bytestoread = size;
                auto dataconsumed = ReadFromExtraData(buffer.get(), bytestoread, extradata);
                bytestoread -= dataconsumed;

                asio::async_read(socket->Socket, asio::buffer(buffer.get() + dataconsumed, bytestoread),
                                 [size, extradata, socket, buffer](const std::error_code &ec, size_t) {
                                     if (!ec) {
                                         UnMaskMessage(size, buffer.get(), isServer);
                                         auto tempsize = size - AdditionalBodyBytesToRead(isServer);
                                         return ProcessControlMessage<isServer>(socket, buffer, tempsize, extradata);
                                     }
                                     else {
                                         return sendclosemessage<isServer>(socket, 1002, "ReadBody Error " + ec.message());
                                     }
                                 });
            }
            else {
                std::shared_ptr<unsigned char> ptr;
                return ProcessControlMessage<isServer>(socket, ptr, 0, extradata);
            }
        }

        else if (opcode == OpCode::TEXT || opcode == OpCode::BINARY || opcode == OpCode::CONTINUATION) {
            auto addedsize = socket->ReceiveBufferSize + size;
            if (addedsize > std::numeric_limits<std::size_t>::max()) {
                SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "payload exceeds memory on system!!! ");
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }
            socket->ReceiveBufferSize = addedsize;

            if (socket->ReceiveBufferSize > socket->Parent->MaxPayload) {
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }
            if (socket->ReceiveBufferSize > std::numeric_limits<std::size_t>::max()) {
                SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "payload exceeds memory on system!!! ");
                return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
            }

            if (size > 0) {
                socket->ReceiveBuffer = static_cast<unsigned char *>(realloc(socket->ReceiveBuffer, socket->ReceiveBufferSize));
                if (!socket->ReceiveBuffer) {
                    SL_WS_LITE_LOG(Logging_Levels::ERROR_log_level, "MEMORY ALLOCATION ERROR!!! Tried to realloc " << socket->ReceiveBufferSize);
                    return sendclosemessage<isServer>(socket, 1009, "Payload exceeded MaxPayload size");
                }

                auto bytestoread = size;
                auto dataconsumed = ReadFromExtraData(socket->ReceiveBuffer + socket->ReceiveBufferSize - size, bytestoread, extradata);
                bytestoread -= dataconsumed;
                asio::async_read(socket->Socket, asio::buffer(socket->ReceiveBuffer + socket->ReceiveBufferSize - size + dataconsumed, bytestoread),
                                 [size, extradata, socket](const std::error_code &ec, size_t) {
                                     if (!ec) {
                                         auto buffer = socket->ReceiveBuffer + socket->ReceiveBufferSize - size;
                                         UnMaskMessage(size, buffer, isServer);
                                         socket->ReceiveBufferSize -= AdditionalBodyBytesToRead(isServer);
                                         return ProcessMessage<isServer>(socket, extradata);
                                     }
                                     else {
                                         return sendclosemessage<isServer>(socket, 1002, "ReadBody Error " + ec.message());
                                     }
                                 });
            }
            else {
                return ProcessMessage<isServer>(socket, extradata);
            }
        }
        else {
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. nonvalid op code");
        }
    }